

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O1

int mpt_type_add(mpt_type_traits *traits)

{
  byte bVar1;
  bool bVar2;
  generic_traits_chunk *pgVar3;
  generic_traits_chunk *pgVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = -1;
  if ((traits != (mpt_type_traits *)0x0) && (traits->size != 0)) {
    pgVar3 = generic_types;
    if (generic_types == (generic_traits_chunk *)0x0) {
      pgVar3 = (generic_traits_chunk *)malloc(0x100);
      if (pgVar3 == (generic_traits_chunk *)0x0) {
        return -4;
      }
      pgVar3->next = (generic_traits_chunk *)0x0;
      pgVar3->used = '\0';
      generic_types = pgVar3;
      atexit(_generic_types_fini);
    }
    iVar6 = 0x900;
    do {
      bVar1 = pgVar3->used;
      if (bVar1 != 0x1e) {
        iVar6 = iVar6 + (uint)bVar1;
        if (0xfff < iVar6) {
          return -3;
        }
        pgVar3->used = bVar1 + 1;
        pgVar3->traits[bVar1] = traits;
        return iVar6;
      }
      iVar6 = iVar6 + 0x1e;
      pgVar4 = pgVar3->next;
      bVar2 = true;
      if (pgVar4 == (generic_traits_chunk *)0x0) {
        if (iVar6 < 0x1000) {
          pgVar4 = (generic_traits_chunk *)malloc(0x100);
          if (pgVar4 != (generic_traits_chunk *)0x0) {
            pgVar4->next = (generic_traits_chunk *)0x0;
            pgVar4->used = '\0';
            pgVar3->next = pgVar4;
            goto LAB_0011c8d4;
          }
          iVar5 = -4;
        }
        else {
          iVar5 = -3;
        }
        bVar2 = false;
        pgVar4 = pgVar3;
      }
LAB_0011c8d4:
      pgVar3 = pgVar4;
    } while (bVar2);
  }
  return iVar5;
}

Assistant:

extern int mpt_type_add(const MPT_STRUCT(type_traits) *traits)
{
	struct generic_traits_chunk *curr;
	int pos = MPT_ENUM(_TypeValueAdd);
	
	/* must have valid size */
	if (!traits || !traits->size) {
		return MPT_ERROR(BadArgument);
	}
	/* create initial traits chunk */
	if (!(curr = generic_types)) {
		if (!(curr = malloc(sizeof(*generic_types)))) {
			return MPT_ERROR(BadOperation);
		}
		curr->next = 0;
		curr->used = 0;
		generic_types = curr;
		atexit(_generic_types_fini);
	}
	/* find available traits chunk entry */
	while (curr->used == MPT_arrsize(curr->traits)) {
		struct generic_traits_chunk *next;
		pos += MPT_arrsize(curr->traits);
		/* append new empty chunk */
		if (!(next = curr->next)) {
			if (pos > MPT_ENUM(_TypeValueMax)) {
				return MPT_ERROR(BadType);
			}
			if (!(next = malloc(sizeof(*next)))) {
				return MPT_ERROR(BadOperation);
			}
			next->next = 0;
			next->used = 0;
			curr->next = next;
		}
		curr = next;
	}
	pos += curr->used;
	if (pos > MPT_ENUM(_TypeValueMax)) {
		return MPT_ERROR(BadType);
	}
	curr->traits[curr->used++] = traits;
	return pos;
}